

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O1

ARTKey __thiscall
duckdb::ARTKey::CreateKey(ARTKey *this,ArenaAllocator *allocator,PhysicalType type,Value *value)

{
  int8_t iVar1;
  bool bVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  ulong *puVar7;
  uint64_t uVar8;
  ulong uVar9;
  InternalException *this_00;
  undefined7 in_register_00000011;
  Value *this_01;
  ulong uVar10;
  idx_t iVar11;
  uint8_t uVar12;
  int iVar13;
  float input;
  double input_00;
  hugeint_t hVar14;
  uhugeint_t uVar15;
  string_t sVar16;
  ARTKey AVar17;
  string_t value_00;
  string local_40;
  
  this_01 = (Value *)CONCAT71(in_register_00000011,type);
  iVar13 = (int)allocator;
  if (199 < iVar13) {
    if (iVar13 == 200) {
      sVar16 = Value::GetValueUnsafe<duckdb::string_t>(this_01);
      value_00.value._0_8_ = sVar16.value._8_8_;
      value_00.value.pointer.ptr = (char *)value;
      AVar17 = CreateARTKey<duckdb::string_t>(this,sVar16.value._0_8_,value_00);
      return AVar17;
    }
    if (iVar13 == 0xcb) {
      uVar15 = Value::GetValueUnsafe<duckdb::uhugeint_t>(this_01);
      uVar10 = uVar15.upper;
      uVar9 = uVar15.lower;
      puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,0x10);
      *puVar7 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28
                | uVar10 << 0x38;
    }
    else {
      if (iVar13 != 0xcc) goto switchD_0170a6f2_caseD_a;
      hVar14 = Value::GetValueUnsafe<duckdb::hugeint_t>(this_01);
      uVar10 = hVar14.upper;
      uVar9 = hVar14.lower;
      puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,0x10);
      *puVar7 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28
                | uVar10 << 0x38;
      *(data_t *)puVar7 = hVar14.upper._7_1_ + 0x80;
    }
    puVar7[1] = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
                uVar9 << 0x38;
    iVar11 = 0x10;
    goto LAB_0170a999;
  }
  switch(iVar13) {
  case 1:
    uVar12 = Value::GetValueUnsafe<bool>(this_01);
    break;
  case 2:
    uVar12 = Value::GetValueUnsafe<unsigned_char>(this_01);
    break;
  case 3:
    iVar1 = Value::GetValueUnsafe<signed_char>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,1);
    uVar12 = iVar1 + 0x80;
    goto LAB_0170a8ac;
  case 4:
    uVar4 = Value::GetValueUnsafe<unsigned_short>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,2);
    *(uint16_t *)puVar7 = uVar4 << 8 | uVar4 >> 8;
    goto LAB_0170a8dc;
  case 5:
    uVar3 = Value::GetValueUnsafe<short>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,2);
    *(ushort *)puVar7 = uVar3 << 8 | uVar3 >> 8;
    *(data_t *)puVar7 = (char)(uVar3 >> 8) + 0x80;
LAB_0170a8dc:
    iVar11 = 2;
    goto LAB_0170a999;
  case 6:
    uVar6 = Value::GetValueUnsafe<unsigned_int>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,4);
    *(uint32_t *)puVar7 =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    goto LAB_0170a92a;
  case 7:
    uVar5 = Value::GetValueUnsafe<int>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,4);
    *(uint *)puVar7 =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    *(data_t *)puVar7 = (char)(uVar5 >> 0x18) + 0x80;
LAB_0170a92a:
    iVar11 = 4;
    goto LAB_0170a999;
  case 8:
    uVar8 = Value::GetValueUnsafe<unsigned_long>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,8);
    *puVar7 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    goto LAB_0170a95b;
  case 9:
    uVar9 = Value::GetValueUnsafe<long>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,8);
    *puVar7 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    *(data_t *)puVar7 = (char)(uVar9 >> 0x38) + 0x80;
LAB_0170a95b:
    iVar11 = 8;
    goto LAB_0170a999;
  default:
switchD_0170a6f2_caseD_a:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Invalid type for the ART key.","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    input = Value::GetValueUnsafe<float>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,4);
    if ((input != 0.0) || (uVar5 = 0x80000000, NAN(input))) {
      bVar2 = Value::IsNan<float>(input);
      uVar5 = 0xffffffff;
      if ((!bVar2) &&
         ((uVar5 = 0xfffffffe, input <= 3.4028235e+38 && (uVar5 = 0, -3.4028235e+38 <= input)))) {
        uVar5 = ~(uint)input;
        if (-1 < (int)input) {
          uVar5 = (uint)input | 0x80000000;
        }
      }
    }
    *(uint *)puVar7 =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    iVar11 = 4;
    goto LAB_0170aa3d;
  case 0xc:
    input_00 = Value::GetValueUnsafe<double>(this_01);
    puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,8);
    if ((input_00 != 0.0) || (NAN(input_00))) {
      bVar2 = Value::IsNan<double>(input_00);
      uVar9 = 0xffffffffffffffff;
      if ((!bVar2) && (uVar9 = 0xfffffffffffffffe, input_00 <= 1.79769313486232e+308)) {
        if (-1.79769313486232e+308 <= input_00) {
          uVar9 = ~(ulong)input_00;
          if (-1 < (long)input_00) {
            uVar9 = (ulong)input_00 | 0x8000000000000000;
          }
        }
        else {
          uVar9 = 0;
        }
      }
    }
    else {
      uVar9 = 0x8000000000000000;
    }
    *puVar7 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
              | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18
              | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    iVar11 = 8;
LAB_0170aa3d:
    ARTKey((ARTKey *)&local_40,(data_ptr_t)puVar7,iVar11);
    goto LAB_0170a9ab;
  }
  puVar7 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,1);
LAB_0170a8ac:
  *(uint8_t *)puVar7 = uVar12;
  iVar11 = 1;
LAB_0170a999:
  ARTKey((ARTKey *)&local_40,(data_ptr_t)puVar7,iVar11);
LAB_0170a9ab:
  AVar17.data = (data_ptr_t)local_40._M_string_length;
  AVar17.len = (idx_t)local_40._M_dataplus._M_p;
  return AVar17;
}

Assistant:

ARTKey ARTKey::CreateKey(ArenaAllocator &allocator, PhysicalType type, Value &value) {
	D_ASSERT(type == value.type().InternalType());
	switch (type) {
	case PhysicalType::BOOL:
		return ARTKey::CreateARTKey<bool>(allocator, value);
	case PhysicalType::INT8:
		return ARTKey::CreateARTKey<int8_t>(allocator, value);
	case PhysicalType::INT16:
		return ARTKey::CreateARTKey<int16_t>(allocator, value);
	case PhysicalType::INT32:
		return ARTKey::CreateARTKey<int32_t>(allocator, value);
	case PhysicalType::INT64:
		return ARTKey::CreateARTKey<int64_t>(allocator, value);
	case PhysicalType::UINT8:
		return ARTKey::CreateARTKey<uint8_t>(allocator, value);
	case PhysicalType::UINT16:
		return ARTKey::CreateARTKey<uint16_t>(allocator, value);
	case PhysicalType::UINT32:
		return ARTKey::CreateARTKey<uint32_t>(allocator, value);
	case PhysicalType::UINT64:
		return ARTKey::CreateARTKey<uint64_t>(allocator, value);
	case PhysicalType::INT128:
		return ARTKey::CreateARTKey<hugeint_t>(allocator, value);
	case PhysicalType::UINT128:
		return ARTKey::CreateARTKey<uhugeint_t>(allocator, value);
	case PhysicalType::FLOAT:
		return ARTKey::CreateARTKey<float>(allocator, value);
	case PhysicalType::DOUBLE:
		return ARTKey::CreateARTKey<double>(allocator, value);
	case PhysicalType::VARCHAR:
		return ARTKey::CreateARTKey<string_t>(allocator, value);
	default:
		throw InternalException("Invalid type for the ART key.");
	}
}